

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::CopySceneFlat(aiScene **_dest,aiScene *src)

{
  aiScene *this;
  aiScene *src_local;
  aiScene **_dest_local;
  
  if ((_dest != (aiScene **)0x0) && (src != (aiScene *)0x0)) {
    if (*_dest == (aiScene *)0x0) {
      this = (aiScene *)operator_new(0x80);
      aiScene::aiScene(this);
      *_dest = this;
    }
    else {
      aiScene::~aiScene(*_dest);
      aiScene::aiScene(*_dest);
    }
    memcpy(*_dest,src,0x80);
  }
  return;
}

Assistant:

void SceneCombiner::CopySceneFlat(aiScene** _dest,const aiScene* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    // reuse the old scene or allocate a new?
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    } else {
        *_dest = new aiScene();
    }

    ::memcpy(*_dest,src,sizeof(aiScene));
}